

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::make_huff_table(jpeg_decoder *this,int index,huff_tables *pH)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long in_RDX;
  int in_ESI;
  jpeg_decoder *in_RDI;
  uint idx;
  int total_codesize;
  int bits_to_fetch;
  int num_extra_bits;
  int extra_bits;
  bool has_extrabits;
  int currententry;
  int nextfreeentry;
  int lastp;
  int code_size;
  uint subtree;
  uint code;
  uint huffcode [258];
  uint8 huffsize [258];
  int si;
  int l;
  int i;
  int p;
  jpgd_status in_stack_fffffffffffffa7c;
  uint local_570;
  uint local_568;
  int local_560;
  int local_55c;
  uint local_54c;
  uint auStack_548 [260];
  byte local_138 [272];
  uint local_28;
  uint local_24;
  uint local_20;
  int local_1c;
  long local_18;
  int local_c;
  
  *(bool *)in_RDX = in_RDI->m_huff_ac[in_ESI] != '\0';
  local_1c = 0;
  for (local_24 = 1; iVar4 = local_1c, (int)local_24 < 0x11; local_24 = local_24 + 1) {
    for (local_20 = 1; (int)local_20 <= (int)(uint)in_RDI->m_huff_num[in_ESI][(int)local_24];
        local_20 = local_20 + 1) {
      if (0x100 < local_1c) {
        stop_decoding(in_RDI,in_stack_fffffffffffffa7c);
      }
      local_138[local_1c] = (byte)local_24;
      local_1c = local_1c + 1;
    }
  }
  if (local_1c < 0x102) {
    local_138[local_1c] = 0;
    local_54c = 0;
    local_28 = (uint)local_138[0];
    local_1c = 0;
    local_18 = in_RDX;
    local_c = in_ESI;
    while (local_138[local_1c] != 0) {
      while (iVar5 = local_1c, local_138[local_1c] == local_28) {
        if (0x100 < local_1c) {
          stop_decoding(in_RDI,in_stack_fffffffffffffa7c);
        }
        local_1c = local_1c + 1;
        auStack_548[iVar5] = local_54c;
        local_54c = local_54c + 1;
      }
      local_54c = local_54c << 1;
      local_28 = local_28 + 1;
    }
    memset((void *)(local_18 + 4),0,0x400);
    memset((void *)(local_18 + 0x404),0,0x400);
    memset((void *)(local_18 + 0x904),0,0x800);
    memset((void *)(local_18 + 0x804),0,0x100);
    local_55c = -1;
    local_1c = 0;
    while( true ) {
      if (iVar4 <= local_1c) {
        return;
      }
      bVar1 = in_RDI->m_huff_val[local_c][local_1c];
      local_20 = (uint)bVar1;
      local_54c = auStack_548[local_1c];
      bVar2 = local_138[local_1c];
      uVar7 = (uint)bVar2;
      if (0xff < local_20) break;
      *(byte *)(local_18 + 0x804 + (long)(int)local_20) = bVar2;
      if (uVar7 < 9) {
        local_54c = local_54c << (8 - bVar2 & 0x1f);
        for (local_24 = 1 << (8 - bVar2 & 0x1f); 0 < (int)local_24; local_24 = local_24 - 1) {
          if (0xff < local_54c) {
            stop_decoding(in_RDI,in_stack_fffffffffffffa7c);
          }
          *(uint *)(local_18 + 4 + (ulong)local_54c * 4) = local_20;
          bVar3 = false;
          local_568 = 0;
          uVar6 = local_20 & 0xf;
          local_570 = uVar7;
          if (((bVar1 & 0xf) != 0) && (uVar7 + uVar6 < 9)) {
            bVar3 = true;
            local_568 = (1 << (sbyte)uVar6) - 1U & local_54c >> (8U - (char)(uVar7 + uVar6) & 0x1f);
            if (0x7fff < (int)local_568) {
              stop_decoding(in_RDI,in_stack_fffffffffffffa7c);
            }
            local_570 = uVar6 + uVar7;
          }
          if (bVar3) {
            *(uint *)(local_18 + 0x404 + (ulong)local_54c * 4) =
                 local_20 | 0x8000 | local_568 << 0x10 | local_570 << 8;
          }
          else {
            *(uint *)(local_18 + 0x404 + (ulong)local_54c * 4) = local_20 | local_570 << 8;
          }
          local_54c = local_54c + 1;
        }
      }
      else {
        uVar6 = local_54c >> (bVar2 - 8 & 0x1f) & 0xff;
        local_560 = *(int *)(local_18 + 4 + (ulong)uVar6 * 4);
        if (local_560 == 0) {
          *(int *)(local_18 + 4 + (ulong)uVar6 * 4) = local_55c;
          local_560 = local_55c;
          *(int *)(local_18 + 0x404 + (ulong)uVar6 * 4) = local_55c;
          local_55c = local_55c + -2;
        }
        local_54c = local_54c << (0x10 - (bVar2 - 8) & 0x1f);
        for (local_24 = uVar7; 9 < (int)local_24; local_24 = local_24 - 1) {
          if ((local_54c & 0x8000) == 0) {
            local_560 = local_560 + -1;
          }
          uVar7 = 0xffffffff - local_560;
          if (0x1ff < uVar7) {
            stop_decoding(in_RDI,in_stack_fffffffffffffa7c);
          }
          if (*(int *)(local_18 + 0x904 + (ulong)uVar7 * 4) == 0) {
            *(int *)(local_18 + 0x904 + (ulong)uVar7 * 4) = local_55c;
            local_560 = local_55c;
            local_55c = local_55c + -2;
          }
          else {
            local_560 = *(int *)(local_18 + 0x904 + (ulong)uVar7 * 4);
          }
          local_54c = local_54c << 1;
        }
        if ((local_54c & 0x8000) == 0) {
          local_560 = local_560 + -1;
        }
        if (0x1ff < -1 - local_560) {
          stop_decoding(in_RDI,in_stack_fffffffffffffa7c);
        }
        *(uint *)(local_18 + 0x904 + (long)(-1 - local_560) * 4) = local_20;
      }
      local_1c = local_1c + 1;
    }
    __assert_fail("i < JPGD_HUFF_CODE_SIZE_MAX_LENGTH",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                  ,0x8ed,"void jpgd::jpeg_decoder::make_huff_table(int, huff_tables *)");
  }
  __assert_fail("p < 258",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                ,0x8c6,"void jpgd::jpeg_decoder::make_huff_table(int, huff_tables *)");
}

Assistant:

void jpeg_decoder::make_huff_table(int index, huff_tables* pH)
	{
		int p, i, l, si;
		uint8 huffsize[258];
		uint huffcode[258];
		uint code;
		uint subtree;
		int code_size;
		int lastp;
		int nextfreeentry;
		int currententry;

		pH->ac_table = m_huff_ac[index] != 0;

		p = 0;

		for (l = 1; l <= 16; l++)
		{
			for (i = 1; i <= m_huff_num[index][l]; i++)
			{
				if (p >= 257)
					stop_decoding(JPGD_DECODE_ERROR);
				huffsize[p++] = static_cast<uint8>(l);
			}
		}

		assert(p < 258);
		huffsize[p] = 0;

		lastp = p;

		code = 0;
		si = huffsize[0];
		p = 0;

		while (huffsize[p])
		{
			while (huffsize[p] == si)
			{
				if (p >= 257)
					stop_decoding(JPGD_DECODE_ERROR);
				huffcode[p++] = code;
				code++;
			}

			code <<= 1;
			si++;
		}

		memset(pH->look_up, 0, sizeof(pH->look_up));
		memset(pH->look_up2, 0, sizeof(pH->look_up2));
		memset(pH->tree, 0, sizeof(pH->tree));
		memset(pH->code_size, 0, sizeof(pH->code_size));

		nextfreeentry = -1;

		p = 0;

		while (p < lastp)
		{
			i = m_huff_val[index][p];

			code = huffcode[p];
			code_size = huffsize[p];

			assert(i < JPGD_HUFF_CODE_SIZE_MAX_LENGTH);
			pH->code_size[i] = static_cast<uint8>(code_size);

			if (code_size <= 8)
			{
				code <<= (8 - code_size);

				for (l = 1 << (8 - code_size); l > 0; l--)
				{
					if (code >= 256)
						stop_decoding(JPGD_DECODE_ERROR);

					pH->look_up[code] = i;

					bool has_extrabits = false;
					int extra_bits = 0;
					int num_extra_bits = i & 15;

					int bits_to_fetch = code_size;
					if (num_extra_bits)
					{
						int total_codesize = code_size + num_extra_bits;
						if (total_codesize <= 8)
						{
							has_extrabits = true;
							extra_bits = ((1 << num_extra_bits) - 1) & (code >> (8 - total_codesize));

							if (extra_bits > 0x7FFF)
								stop_decoding(JPGD_DECODE_ERROR);

							bits_to_fetch += num_extra_bits;
						}
					}

					if (!has_extrabits)
						pH->look_up2[code] = i | (bits_to_fetch << 8);
					else
						pH->look_up2[code] = i | 0x8000 | (extra_bits << 16) | (bits_to_fetch << 8);

					code++;
				}
			}
			else
			{
				subtree = (code >> (code_size - 8)) & 0xFF;

				currententry = pH->look_up[subtree];

				if (currententry == 0)
				{
					pH->look_up[subtree] = currententry = nextfreeentry;
					pH->look_up2[subtree] = currententry = nextfreeentry;

					nextfreeentry -= 2;
				}

				code <<= (16 - (code_size - 8));

				for (l = code_size; l > 9; l--)
				{
					if ((code & 0x8000) == 0)
						currententry--;

					unsigned int idx = -currententry - 1;

					if (idx >= JPGD_HUFF_TREE_MAX_LENGTH)
						stop_decoding(JPGD_DECODE_ERROR);

					if (pH->tree[idx] == 0)
					{
						pH->tree[idx] = nextfreeentry;

						currententry = nextfreeentry;

						nextfreeentry -= 2;
					}
					else
					{
						currententry = pH->tree[idx];
					}

					code <<= 1;
				}

				if ((code & 0x8000) == 0)
					currententry--;

				if ((-currententry - 1) >= JPGD_HUFF_TREE_MAX_LENGTH)
					stop_decoding(JPGD_DECODE_ERROR);

				pH->tree[-currententry - 1] = i;
			}

			p++;
		}
	}